

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O1

int EVP_PKEY_CTX_get0_rsa_oaep_label(EVP_PKEY_CTX *ctx,uint8_t **out_label)

{
  int iVar1;
  int iVar2;
  CBS label;
  uint8_t *local_20;
  ulong local_18;
  
  iVar1 = EVP_PKEY_CTX_ctrl((EVP_PKEY_CTX *)ctx,6,0xc0,0x100c,0,&local_20);
  iVar2 = -1;
  if (iVar1 != 0) {
    if ((local_18 & 0xffffffff80000000) == 0) {
      *out_label = local_20;
      iVar2 = (int)local_18;
    }
    else {
      ERR_put_error(6,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x25c);
    }
  }
  return iVar2;
}

Assistant:

int EVP_PKEY_CTX_get0_rsa_oaep_label(EVP_PKEY_CTX *ctx,
                                     const uint8_t **out_label) {
  CBS label;
  if (!EVP_PKEY_CTX_ctrl(ctx, EVP_PKEY_RSA, EVP_PKEY_OP_TYPE_CRYPT,
                         EVP_PKEY_CTRL_GET_RSA_OAEP_LABEL, 0, &label)) {
    return -1;
  }
  if (CBS_len(&label) > INT_MAX) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_OVERFLOW);
    return -1;
  }
  *out_label = CBS_data(&label);
  return (int)CBS_len(&label);
}